

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PopClipRect(void)

{
  ImGuiWindow *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec4 *pIVar5;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  ImDrawList::PopClipRect(pIVar1->DrawList);
  pIVar5 = ImVector<ImVec4>::back(&pIVar1->DrawList->_ClipRectStack);
  fVar2 = pIVar5->y;
  fVar3 = pIVar5->z;
  fVar4 = pIVar5->w;
  (pIVar1->ClipRect).Min.x = pIVar5->x;
  (pIVar1->ClipRect).Min.y = fVar2;
  (pIVar1->ClipRect).Max.x = fVar3;
  (pIVar1->ClipRect).Max.y = fVar4;
  return;
}

Assistant:

int ImTextStrFromUtf8(ImWchar* buf, int buf_size, const char* in_text, const char* in_text_end, const char** in_text_remaining)
{
    ImWchar* buf_out = buf;
    ImWchar* buf_end = buf + buf_size;
    while (buf_out < buf_end-1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        if (c < 0x10000)    // FIXME: Losing characters that don't fit in 2 bytes
            *buf_out++ = (ImWchar)c;
    }
    *buf_out = 0;
    if (in_text_remaining)
        *in_text_remaining = in_text;
    return (int)(buf_out - buf);
}